

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::CheckParameterError
          (DefaultsTest *this,GLchar *pname_string,GLchar *function_string)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar2 != 0) {
    local_1a0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    iVar1 = (int)(ostringstream *)&local_198;
    if (function_string == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_198[-3]);
    }
    else {
      sVar3 = strlen(function_string);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_198,function_string,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," called with ",0xd);
    if (pname_string == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_198[-3]);
    }
    else {
      sVar3 = strlen(pname_string);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pname_string,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," parameter name unexpectedly returned ",0x26);
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"error.",6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  return iVar2 == 0;
}

Assistant:

bool DefaultsTest::CheckParameterError(const glw::GLchar* pname_string, const glw::GLchar* function_string)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Error check. */
	if (glw::GLenum error = gl.getError())
	{
		/* Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function_string << " called with "
											<< pname_string << " parameter name unexpectedly returned "
											<< glu::getErrorStr(error) << "error." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}